

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O2

void __thiscall cppcms::impl::url_rewriter::rule::rule(rule *this,string *r,string *pat,bool fin)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  long lVar4;
  size_type *psVar5;
  cppcms_error *this_00;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string subpat;
  
  bVar7 = false;
  booster::regex::regex(&this->expression,(string *)r,0);
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pattern).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->pattern).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pattern).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->final = fin;
  do {
    lVar4 = std::__cxx11::string::find((char)pat,0x24);
    std::__cxx11::string::substr((ulong)&subpat,(ulong)pat);
    if (bVar7) {
      std::__cxx11::string::append
                ((string *)
                 ((this->pattern).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1));
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->pattern,&subpat);
    }
    if (lVar4 != -1) {
      if (pat->_M_string_length <= lVar4 + 1U) {
        this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(&local_70,"Invalid rewrite pattern :",pat);
        cppcms_error::cppcms_error(this_00,&local_70);
        __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      iVar3 = (int)(pat->_M_dataplus)._M_p[lVar4 + 1];
      if (iVar3 == 0x24) {
        bVar7 = true;
        std::__cxx11::string::push_back
                  ((char)(this->pattern).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -0x20);
      }
      else {
        local_70._M_dataplus._M_p._0_4_ = iVar3 + -0x30;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->index,(int *)&local_70);
        bVar7 = false;
      }
    }
    std::__cxx11::string::~string((string *)&subpat);
  } while (lVar4 != -1);
  this->pattern_size = 0;
  pbVar1 = (this->pattern).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->pattern).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar5 = &pbVar1->_M_string_length;
  sVar6 = 0;
  for (uVar8 = 0; uVar8 < (ulong)((long)pbVar2 - (long)pbVar1 >> 5); uVar8 = uVar8 + 1) {
    sVar6 = sVar6 + *psVar5;
    this->pattern_size = sVar6;
    psVar5 = psVar5 + 4;
  }
  return;
}

Assistant:

rule(std::string const &r,std::string const &pat,bool fin=true) :
			expression(r),
			final(fin)
		{
			size_t pos = 0;
			bool append = false;
			for(;;){
				size_t start = pos;
				pos = pat.find('$',pos);
				std::string subpat = pat.substr(start,pos-start);
				if(append)
					pattern.back().append(subpat);
				else
					pattern.push_back(subpat);
				if(pos==std::string::npos) 
					break;
				pos++;
				char c;
				if(pos >= pat.size() || ((c=pat[pos++])!='$' && c < '0' && '9' < c)) 
					throw cppcms_error("Invalid rewrite pattern :" + pat);
				if(c=='$') {
					pattern.back()+='$';
					append=true;
				}
				else {
					index.push_back(c-'0');
					append=false;
				}

			}
			pattern_size = 0;
			for(size_t i=0;i<pattern.size();i++)
				pattern_size+=pattern[i].size();
		}